

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

void QUtil::read_file_into_memory(char *filename,shared_ptr<char> *file_buf,size_t *size)

{
  int iVar1;
  size_t sVar2;
  runtime_error *prVar3;
  int length;
  size_t *psVar4;
  string local_288;
  string local_268;
  allocator<char> local_241;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_179;
  string local_178;
  string local_158;
  allocator<char> local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  size_t local_70;
  size_t len;
  size_t bytes_read;
  char *buf_p;
  qpdf_offset_t local_48 [3];
  FileCloser local_30;
  FileCloser fc;
  FILE *f;
  size_t *size_local;
  shared_ptr<char> *file_buf_local;
  char *filename_local;
  
  fc.f = safe_fopen(filename,"rb");
  FileCloser::FileCloser(&local_30,fc.f);
  fseek((FILE *)fc.f,0,2);
  local_48[0] = tell(fc.f);
  sVar2 = QIntC::to_size<long_long>(local_48);
  *size = sVar2;
  fseek((FILE *)fc.f,0,0);
  make_shared_array<char>((QUtil *)&buf_p,*size);
  std::shared_ptr<char>::operator=(file_buf,(shared_ptr<char> *)&buf_p);
  std::shared_ptr<char>::~shared_ptr((shared_ptr<char> *)&buf_p);
  bytes_read = (size_t)std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                                 (&file_buf->super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>);
  len = 0;
  local_70 = 0;
  while( true ) {
    local_70 = fread((void *)(bytes_read + len),1,*size - len,(FILE *)fc.f);
    if (local_70 == 0) break;
    len = local_70 + len;
  }
  if (len != *size) {
    psVar4 = size;
    iVar1 = ferror((FILE *)fc.f);
    length = (int)psVar4;
    if (iVar1 != 0) {
      local_179 = 1;
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"failure reading file ",&local_131);
      std::operator+(&local_110,&local_130,filename);
      std::operator+(&local_f0,&local_110," into memory: read ");
      uint_to_string_abi_cxx11_(&local_158,(QUtil *)len,0,length);
      std::operator+(&local_d0,&local_f0,&local_158);
      std::operator+(&local_b0,&local_d0,"; wanted ");
      uint_to_string_abi_cxx11_(&local_178,(QUtil *)*size,0,length);
      std::operator+(&local_90,&local_b0,&local_178);
      std::runtime_error::runtime_error(prVar3,(string *)&local_90);
      local_179 = 0;
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_240,"premature eof reading file ",&local_241);
    std::operator+(&local_220,&local_240,filename);
    std::operator+(&local_200,&local_220," into memory: read ");
    uint_to_string_abi_cxx11_(&local_268,(QUtil *)len,0,length);
    std::operator+(&local_1e0,&local_200,&local_268);
    std::operator+(&local_1c0,&local_1e0,"; wanted ");
    uint_to_string_abi_cxx11_(&local_288,(QUtil *)*size,0,length);
    std::operator+(&local_1a0,&local_1c0,&local_288);
    std::runtime_error::runtime_error(prVar3,(string *)&local_1a0);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  FileCloser::~FileCloser(&local_30);
  return;
}

Assistant:

void
QUtil::read_file_into_memory(char const* filename, std::shared_ptr<char>& file_buf, size_t& size)
{
    FILE* f = safe_fopen(filename, "rb");
    FileCloser fc(f);
    fseek(f, 0, SEEK_END);
    size = QIntC::to_size(QUtil::tell(f));
    fseek(f, 0, SEEK_SET);
    file_buf = QUtil::make_shared_array<char>(size);
    char* buf_p = file_buf.get();
    size_t bytes_read = 0;
    size_t len = 0;
    while ((len = fread(buf_p + bytes_read, 1, size - bytes_read, f)) > 0) {
        bytes_read += len;
    }
    if (bytes_read != size) {
        if (ferror(f)) {
            throw std::runtime_error(
                std::string("failure reading file ") + filename + " into memory: read " +
                uint_to_string(bytes_read) + "; wanted " + uint_to_string(size));
        } else {
            throw std::runtime_error(
                std::string("premature eof reading file ") + filename + " into memory: read " +
                uint_to_string(bytes_read) + "; wanted " + uint_to_string(size));
        }
    }
}